

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

LY_ERR lysp_ext_find_definition
                 (ly_ctx *ctx,lysp_ext_instance *ext,lys_module **ext_mod,lysp_ext **ext_def)

{
  lysp_ext *plVar1;
  lysp_ext *plVar2;
  lysp_include *plVar3;
  char *__s1;
  int iVar4;
  LY_ERR LVar5;
  lys_module *plVar6;
  lysc_ext *plVar7;
  ulong uVar8;
  lysp_ext *plVar9;
  ulong uVar10;
  lysc_ext *plVar11;
  char *name;
  size_t pref_len;
  char *prefix;
  size_t name_len;
  char *tmp;
  char *local_58;
  uint local_50;
  undefined4 uStack_4c;
  char *local_48;
  size_t local_40;
  char *local_38;
  
  if (ext_def != (lysp_ext **)0x0) {
    *ext_def = (lysp_ext *)0x0;
  }
  local_38 = ext->name;
  ly_parse_nodeid(&local_38,&local_48,(size_t *)&local_50,&local_58,&local_40);
  plVar6 = ly_resolve_prefix(ctx,local_48,CONCAT44(uStack_4c,local_50),ext->format,ext->prefix_data)
  ;
  __s1 = local_58;
  *ext_mod = plVar6;
  if (plVar6 == (lys_module *)0x0) {
    ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
            "Invalid prefix \"%.*s\" used for extension instance identifier.",(ulong)local_50,
            local_48);
LAB_00166343:
    LVar5 = LY_EVALID;
  }
  else {
    if (ext_def != (lysp_ext **)0x0) {
      plVar2 = plVar6->parsed->extensions;
      plVar9 = plVar2 + -1;
      plVar11 = (lysc_ext *)0xffffffffffffffff;
      do {
        if (plVar2 == (lysp_ext *)0x0) {
          plVar7 = (lysc_ext *)0x0;
        }
        else {
          plVar7 = plVar2[-1].compiled;
        }
        plVar11 = (lysc_ext *)((long)&plVar11->name + 1);
        if (plVar7 <= plVar11) goto LAB_0016626a;
        plVar1 = plVar9 + 1;
        plVar9 = plVar9 + 1;
        iVar4 = strcmp(__s1,plVar1->name);
      } while (iVar4 != 0);
      *ext_def = plVar9;
LAB_0016626a:
      if (*ext_def == (lysp_ext *)0x0) {
        uVar10 = 0;
        while( true ) {
          plVar3 = plVar6->parsed->includes;
          if (plVar3 == (lysp_include *)0x0) {
            uVar8 = 0;
          }
          else {
            uVar8 = *(ulong *)(plVar3[-1].rev + 8);
          }
          if (uVar8 <= uVar10) break;
          plVar2 = (plVar3[uVar10].submodule)->extensions;
          plVar9 = plVar2 + -1;
          plVar11 = (lysc_ext *)0xffffffffffffffff;
          do {
            if (plVar2 == (lysp_ext *)0x0) {
              plVar7 = (lysc_ext *)0x0;
            }
            else {
              plVar7 = plVar2[-1].compiled;
            }
            plVar11 = (lysc_ext *)((long)&plVar11->name + 1);
            if (plVar7 <= plVar11) goto LAB_0016631c;
            plVar1 = plVar9 + 1;
            plVar9 = plVar9 + 1;
            iVar4 = strcmp(local_58,plVar1->name);
          } while (iVar4 != 0);
          *ext_def = plVar9;
LAB_0016631c:
          uVar10 = uVar10 + 1;
        }
      }
      if (*ext_def == (lysp_ext *)0x0) {
        ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
                "Extension definition of extension instance \"%s\" not found.",ext->name);
        goto LAB_00166343;
      }
    }
    LVar5 = LY_SUCCESS;
  }
  return LVar5;
}

Assistant:

LY_ERR
lysp_ext_find_definition(const struct ly_ctx *ctx, const struct lysp_ext_instance *ext, const struct lys_module **ext_mod,
        struct lysp_ext **ext_def)
{
    const char *tmp, *name, *prefix;
    size_t pref_len, name_len;
    LY_ARRAY_COUNT_TYPE u, v;
    const struct lys_module *mod = NULL;
    const struct lysp_submodule *submod;

    if (ext_def) {
        *ext_def = NULL;
    }

    /* parse the prefix, the nodeid was previously already parsed and checked */
    tmp = ext->name;
    ly_parse_nodeid(&tmp, &prefix, &pref_len, &name, &name_len);

    /* get module where the extension definition should be placed */
    *ext_mod = mod = ly_resolve_prefix(ctx, prefix, pref_len, ext->format, ext->prefix_data);
    if (!mod) {
        LOGVAL(ctx, LYVE_REFERENCE, "Invalid prefix \"%.*s\" used for extension instance identifier.", (int)pref_len, prefix);
        return LY_EVALID;
    }

    if (!ext_def) {
        /* we are done */
        return LY_SUCCESS;
    }

    /* find the parsed extension definition there */
    LY_ARRAY_FOR(mod->parsed->extensions, v) {
        if (!strcmp(name, mod->parsed->extensions[v].name)) {
            *ext_def = &mod->parsed->extensions[v];
            break;
        }
    }
    if (!*ext_def) {
        LY_ARRAY_FOR(mod->parsed->includes, u) {
            submod = mod->parsed->includes[u].submodule;
            LY_ARRAY_FOR(submod->extensions, v) {
                if (!strcmp(name, submod->extensions[v].name)) {
                    *ext_def = &submod->extensions[v];
                    break;
                }
            }
        }
    }

    if (!*ext_def) {
        LOGVAL(ctx, LYVE_REFERENCE, "Extension definition of extension instance \"%s\" not found.", ext->name);
        return LY_EVALID;
    }

    return LY_SUCCESS;
}